

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
               (string *s,char *fmt,float *v,int *args,int *args_1,int *args_2,int *args_3,
               int *args_4,int *args_5,int *args_6,int *args_7,int *args_8,MajorantGrid **args_9)

{
  bool bVar1;
  long lVar2;
  char **v_00;
  ulong uVar3;
  int *in_RCX;
  float *in_RDX;
  string *unaff_RBX;
  int *in_RSI;
  string *in_RDI;
  int *in_R8;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int *in_stack_00000028;
  int *in_stack_00000030;
  MajorantGrid **in_stack_00000038;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd50;
  char **in_stack_fffffffffffffd58;
  float *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  string local_278 [32];
  undefined8 local_258;
  string local_250 [32];
  stringstream local_230 [8];
  char *in_stack_fffffffffffffdd8;
  undefined1 local_220 [4];
  int in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffde8;
  LogLevel in_stack_fffffffffffffdf4;
  float in_stack_fffffffffffffe2c;
  string local_a8 [53];
  byte local_73;
  byte local_72;
  byte local_71;
  string local_70 [40];
  
  copyToFormatString(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  lVar2 = std::__cxx11::string::find((char)local_70,0x2a);
  local_71 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_70,0x73);
  local_72 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_70,100);
  local_73 = lVar2 != -1;
  if ((local_71 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
             in_stack_fffffffffffffdd8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe2c);
    std::__cxx11::string::operator+=(in_RDI,local_a8);
    std::__cxx11::string::~string(local_a8);
  }
  else {
    if ((local_73 & 1) != 0) {
      LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
               in_stack_fffffffffffffdd8);
    }
    if ((local_72 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4,
                 in_stack_fffffffffffffdd8);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd68);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_230);
      std::ostream::operator<<(local_220,*in_RDX);
      v_00 = (char **)std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_258 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd68,v_00);
      std::__cxx11::string::operator+=(in_RDI,local_250);
      std::__cxx11::string::~string(local_250);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::stringstream::~stringstream(local_230);
    }
  }
  stringPrintfRecursive<int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,int_const&,pbrt::MajorantGrid_const*const&>
            (unaff_RBX,(char *)in_RDI,in_RSI,(int *)in_RDX,in_RCX,in_R8,in_stack_00000010,
             in_stack_00000018,in_stack_00000020,in_stack_00000028,in_stack_00000030,
             in_stack_00000038);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}